

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExtraData.cpp
# Opt level: O1

void __thiscall ExtraData::parseColorTableUtils(ExtraData *this,int posStart)

{
  ostream *poVar1;
  
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,Utils::defaultOffset_abi_cxx11_._M_dataplus._M_p,
                      Utils::defaultOffset_abi_cxx11_._M_string_length);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  return;
}

Assistant:

void ExtraData::parseColorTableUtils(int posStart) {
    cout << Utils::defaultOffset << CONSOLE_PROPS.ColorTable[posStart] << " " << CONSOLE_PROPS.ColorTable[posStart + 1] << " " <<
         CONSOLE_PROPS.ColorTable[posStart + 2] << " " << CONSOLE_PROPS.ColorTable[posStart + 3] << endl;
}